

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String __thiscall
testing::internal::AppendUserMessage(internal *this,String *gtest_msg,Message *user_msg)

{
  char cVar1;
  char *pcVar2;
  void *pvVar3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar4;
  long lVar5;
  ostream *poVar6;
  String SVar7;
  String user_msg_string;
  char local_51;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  void *local_48;
  long local_40;
  internal *local_38;
  
  StringStreamToString((internal *)&local_48,(user_msg->ss_).ptr_);
  if ((local_48 == (void *)0x0) || (local_40 != 0)) {
    Message::Message((Message *)&local_50);
    poVar6 = (ostream *)(local_50.ptr_ + 0x10);
    if (local_50.ptr_ == (stringstream *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    pcVar2 = gtest_msg->c_str_;
    local_38 = this;
    if (pcVar2 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(null)",6);
    }
    else if (gtest_msg->length_ != 0) {
      sVar4 = 0;
      do {
        cVar1 = pcVar2[sVar4];
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\0",2);
        }
        else {
          local_51 = cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_51,1);
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 != gtest_msg->length_);
    }
    poVar6 = (ostream *)(local_50.ptr_ + 0x10);
    if (local_50.ptr_ == (stringstream *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    pvVar3 = local_48;
    poVar6 = (ostream *)(local_50.ptr_ + 0x10);
    if (local_50.ptr_ == (stringstream *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    if (local_48 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(null)",6);
    }
    else if (local_40 != 0) {
      lVar5 = 0;
      do {
        if (*(char *)((long)pvVar3 + lVar5) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\0",2);
        }
        else {
          local_51 = *(char *)((long)pvVar3 + lVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_51,1);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != local_40);
    }
    SVar7 = StringStreamToString(local_38,local_50.ptr_);
    sVar4 = SVar7.length_;
    this = local_38;
    if (local_50.ptr_ != (stringstream *)0x0) {
      (**(code **)(*(long *)local_50.ptr_ + 8))();
      sVar4 = extraout_RDX_00;
      this = local_38;
    }
  }
  else {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    String::operator=((String *)this,gtest_msg);
    sVar4 = extraout_RDX;
  }
  if (local_48 != (void *)0x0) {
    operator_delete__(local_48);
    sVar4 = extraout_RDX_01;
  }
  SVar7.length_ = sVar4;
  SVar7.c_str_ = (char *)this;
  return SVar7;
}

Assistant:

String AppendUserMessage(const String& gtest_msg,
                         const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const String user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  Message msg;
  msg << gtest_msg << "\n" << user_msg_string;

  return msg.GetString();
}